

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateLoad
          (InterfaceVariableScalarReplacement *this,uint32_t type_id,Instruction *ptr,
          Instruction *insert_before)

{
  IRContext *c;
  uint32_t res_id;
  Instruction *this_00;
  DefUseManager *this_01;
  initializer_list<unsigned_int> init_list;
  uint32_t local_ac;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_a8;
  undefined4 local_a0 [2];
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this_00 = (Instruction *)operator_new(0x70);
  c = (this->super_Pass).context_;
  res_id = Pass::TakeNextId(&this->super_Pass);
  local_ac = Instruction::result_id(ptr);
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
  local_a0[0] = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,&local_70);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_a0,&local_70);
  Instruction::Instruction(this_00,c,OpLoad,type_id,res_id,(OperandList *)&local_48);
  local_a8._M_head_impl = this_00;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
  this_01 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  analysis::DefUseManager::AnalyzeInstDefUse(this_01,this_00);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_a8);
  if (local_a8._M_head_impl != (Instruction *)0x0) {
    (*((local_a8._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return this_00;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateLoad(
    uint32_t type_id, Instruction* ptr, Instruction* insert_before) {
  std::unique_ptr<Instruction> load(
      new Instruction(context(), spv::Op::OpLoad, type_id, TakeNextId(),
                      std::initializer_list<Operand>{
                          {SPV_OPERAND_TYPE_ID, {ptr->result_id()}}}));
  Instruction* load_inst = load.get();
  context()->get_def_use_mgr()->AnalyzeInstDefUse(load_inst);
  insert_before->InsertBefore(std::move(load));
  return load_inst;
}